

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O0

void * nghttp2_map_find(nghttp2_map *map,nghttp2_map_key_type key)

{
  uint32_t hash;
  nghttp2_map_bucket *bkt_00;
  size_t sVar1;
  ulong local_38;
  size_t d;
  nghttp2_map_bucket *bkt;
  size_t idx;
  uint32_t h;
  nghttp2_map_key_type key_local;
  nghttp2_map *map_local;
  
  hash = ::hash(key);
  bkt = (nghttp2_map_bucket *)h2idx(hash,map->tablelenbits);
  for (local_38 = 0;
      (bkt_00 = map->table + (long)bkt, bkt_00->data != (void *)0x0 &&
      (sVar1 = distance(map->tablelen,map->tablelenbits,bkt_00,(size_t)bkt), local_38 <= sVar1));
      local_38 = local_38 + 1) {
    if (bkt_00->key == key) {
      return bkt_00->data;
    }
    bkt = (nghttp2_map_bucket *)((ulong)((long)&bkt->hash + 1U) & (ulong)(map->tablelen - 1));
  }
  return (void *)0x0;
}

Assistant:

void *nghttp2_map_find(nghttp2_map *map, nghttp2_map_key_type key) {
  uint32_t h = hash(key);
  size_t idx = h2idx(h, map->tablelenbits);
  nghttp2_map_bucket *bkt;
  size_t d = 0;

  for (;;) {
    bkt = &map->table[idx];

    if (bkt->data == NULL ||
        d > distance(map->tablelen, map->tablelenbits, bkt, idx)) {
      return NULL;
    }

    if (bkt->key == key) {
      return bkt->data;
    }

    ++d;
    idx = (idx + 1) & (map->tablelen - 1);
  }
}